

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-parser.cc
# Opt level: O2

void __thiscall GenParser::visit(GenParser *this,Question *node)

{
  IRBuilder *this_00;
  BasicBlock *iffalse;
  Temp *target;
  string local_48;
  
  this_00 = &this->super_IRBuilder;
  iffalse = IR::IRBuilder::newBasicBlock(this_00);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  target = IR::IRBuilder::newTemp(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  IR::IRBuilder::save(this_00,target);
  CodeGenerator::condition
            (&this->super_CodeGenerator,(node->super_Postfix).item,
             (this->super_CodeGenerator).code.iftrue,iffalse);
  IR::IRBuilder::place(this_00,iffalse);
  IR::IRBuilder::restore(this_00,target);
  IR::IRBuilder::jump(this_00,(this->super_CodeGenerator).code.iftrue);
  return;
}

Assistant:

void GenParser::visit(ast::Question* node) {
  auto iffalse = newBasicBlock();
  auto target = newTemp();

  save(target);
  condition(node->item, code.iftrue, iffalse);
  place(iffalse);
  restore(target);
  jump(code.iftrue);
}